

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

Union * __thiscall
matchit::impl::IdBlock<mathiu::impl::Union>::get(IdBlock<mathiu::impl::Union> *this)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>_&>
  pUVar1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1189:33)>
  local_1;
  
  pUVar1 = std::
           visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Union,mathiu::impl::Union*,mathiu::impl::Union_const*>const&>
                     (&local_1,&(this->super_IdBlockBase<mathiu::impl::Union>).mVariant);
  return pUVar1;
}

Assistant:

constexpr decltype(auto) get() const
            {
                return std::visit(
                    overload([](Type const &v) -> Type const & { return v; },
                                [](Type const *p) -> Type const & { return *p; },
                                [](Type *p) -> Type const & { return *p; },
                                [](std::monostate const &) -> Type const & {
                                    throw std::logic_error("invalid state!");
                                }),
                    IdBlockBase<Type>::mVariant);
            }